

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastunpack24_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 & 0xffffff;
  out[1] = uVar1 >> 0x18;
  uVar2 = in[1];
  out[1] = uVar1 >> 0x18 | (uVar2 & 0xffff) << 8;
  out[2] = uVar2 >> 0x10;
  uVar1 = in[2];
  out[2] = uVar2 >> 0x10 | (uVar1 & 0xff) << 0x10;
  out[3] = uVar1 >> 8;
  uVar1 = in[3];
  out[4] = uVar1 & 0xffffff;
  uVar2 = in[4];
  out[5] = uVar1 >> 0x18;
  out[5] = uVar1 >> 0x18 | (uVar2 & 0xffff) << 8;
  out[6] = uVar2 >> 0x10;
  uVar1 = in[5];
  out[6] = uVar2 >> 0x10 | (uVar1 & 0xff) << 0x10;
  out[7] = uVar1 >> 8;
  return in + 6;
}

Assistant:

const uint32_t *__fastunpack24_8(const uint32_t *__restrict__ in,
                                 uint32_t *__restrict__ out) {

  *out = ((*in) >> 0) % (1U << 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 16)) << (24 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 8)) << (24 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  out++;
  *out = ((*in) >> 0) % (1U << 24);
  out++;
  *out = ((*in) >> 24);
  ++in;
  *out |= ((*in) % (1U << 16)) << (24 - 16);
  out++;
  *out = ((*in) >> 16);
  ++in;
  *out |= ((*in) % (1U << 8)) << (24 - 8);
  out++;
  *out = ((*in) >> 8);
  ++in;
  out++;

  return in;
}